

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeMessageSetItemWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  int iVar1;
  uint32 value;
  undefined4 extraout_var;
  long *plVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  io::CodedOutputStream::WriteVarint32(output,0xb);
  io::CodedOutputStream::WriteVarint32(output,0x10);
  io::CodedOutputStream::WriteVarint32(output,*(uint32 *)(field + 0x38));
  io::CodedOutputStream::WriteVarint32(output,0x1a);
  plVar2 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd8))
                             ((long *)CONCAT44(extraout_var,iVar1),message,field,0);
  value = (**(code **)(*plVar2 + 0x78))(plVar2);
  io::CodedOutputStream::WriteVarint32(output,value);
  (**(code **)(*plVar2 + 0x68))(plVar2,output);
  io::CodedOutputStream::WriteVarint32(output,0xc);
  return;
}

Assistant:

void WireFormat::SerializeMessageSetItemWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  // Start group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemStartTag);

  // Write type ID.
  output->WriteVarint32(WireFormatLite::kMessageSetTypeIdTag);
  output->WriteVarint32(field->number());

  // Write message.
  output->WriteVarint32(WireFormatLite::kMessageSetMessageTag);

  const Message& sub_message = message_reflection->GetMessage(message, field);
  output->WriteVarint32(sub_message.GetCachedSize());
  sub_message.SerializeWithCachedSizes(output);

  // End group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemEndTag);
}